

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::NotImplementedException::NotImplementedException
          (NotImplementedException *this,SourceLineInfo *lineInfo)

{
  ostringstream oss;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  *(undefined ***)this = &PTR__NotImplementedException_0018ad58;
  (this->m_what)._M_dataplus._M_p = (pointer)&(this->m_what).field_2;
  (this->m_what)._M_string_length = 0;
  (this->m_what).field_2._M_local_buf[0] = '\0';
  SourceLineInfo::SourceLineInfo(&this->m_lineInfo,lineInfo);
  std::__cxx11::ostringstream::ostringstream(local_198);
  operator<<((ostream *)local_198,lineInfo);
  std::operator<<((ostream *)local_198,": function ");
  std::operator<<((ostream *)local_198,"not implemented");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_what,asStack_1b8);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

NotImplementedException::NotImplementedException( SourceLineInfo const& lineInfo )
    :   m_lineInfo( lineInfo ) {
        std::ostringstream oss;
        oss << lineInfo << ": function ";
        oss << "not implemented";
        m_what = oss.str();
    }